

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O1

JSON_Status json_object_dotset_number(JSON_Object *object,char *name,double number)

{
  JSON_Status JVar1;
  JSON_Value *value;
  JSON_Status JVar2;
  
  if ((ulong)ABS(number) < 0x7ff0000000000000) {
    value = (JSON_Value *)(*parson_malloc)(0x20);
    if (value != (JSON_Value *)0x0) {
      value->parent = (JSON_Value *)0x0;
      value->type = 3;
      (value->value).number = number;
      goto LAB_001c326a;
    }
  }
  value = (JSON_Value *)0x0;
LAB_001c326a:
  JVar2 = -1;
  if (value != (JSON_Value *)0x0) {
    JVar1 = json_object_dotset_value(object,name,value);
    if (JVar1 == 0) {
      JVar2 = 0;
    }
    else {
      json_value_free(value);
    }
  }
  return JVar2;
}

Assistant:

JSON_Status json_object_dotset_number(JSON_Object *object, const char *name, double number) {
    JSON_Value *value = json_value_init_number(number);
    if (value == NULL) {
        return JSONFailure;
    }
    if (json_object_dotset_value(object, name, value) != JSONSuccess) {
        json_value_free(value);
        return JSONFailure;
    }
    return JSONSuccess;
}